

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

uint32_t __thiscall
cfd::ConfidentialTransactionContext::GetTxInIndex
          (ConfidentialTransactionContext *this,OutPoint *outpoint)

{
  undefined4 uVar1;
  uint32_t uVar2;
  Txid local_30;
  
  cfd::core::OutPoint::GetTxid();
  uVar1 = cfd::core::OutPoint::GetVout();
  uVar2 = (**(code **)(*(long *)this + 0x10))(this,&local_30,uVar1);
  core::Txid::~Txid(&local_30);
  return uVar2;
}

Assistant:

uint32_t ConfidentialTransactionContext::GetTxInIndex(
    const OutPoint& outpoint) const {
  return GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
}